

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void e2e_kvs_index_pattern(int n_checkpoints,fdb_config fconfig,bool deletes,bool walflush)

{
  storage_t *st;
  int iVar1;
  int iVar2;
  fdb_kvs_config local_490;
  idx_prams_t local_478;
  checkpoint_t local_460;
  
  fdb_get_default_kvs_config();
  memleak_start();
  rm_storage_fs();
  gen_index_params(&local_478);
  iVar1 = 0;
  memset(&local_460,0,0x430);
  st = init_storage(&fconfig,&fconfig,&local_490,&local_478,&local_460,walflush);
  if (0 < n_checkpoints) {
    do {
      start_checkpoint(st);
      iVar2 = 100;
      do {
        load_persons(st);
        if (deletes) {
          delete_persons(st);
        }
        verify_db(st);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      end_checkpoint(st);
      update_index(st,true);
      verify_db(st);
      iVar1 = iVar1 + 1;
    } while (iVar1 != n_checkpoints);
  }
  if (fconfig.compaction_mode != '\x01') {
    replay(st);
  }
  e2e_fdb_shutdown(st);
  memleak_end();
  return;
}

Assistant:

void e2e_kvs_index_pattern(int n_checkpoints, fdb_config fconfig,
                           bool deletes, bool walflush) {

    int n, i;
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    n_checkpoints = n_checkpoints * LOAD_FACTOR;

    memleak_start();

    // init
    rm_storage_fs();
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));

    // setup
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // test
    for (n = 0; n < n_checkpoints; ++n) {

        // checkpoint
        start_checkpoint(st);

        for (i = 0; i < 100; ++i) {
#ifdef __DEBUG_E2E
            printf("\n\n----%d----\n", i);
#endif
            load_persons(st);
            if (deletes) {
                delete_persons(st);
            }
            verify_db(st);
        }

        // end checkpoint
        end_checkpoint(st);

        // change index range
        update_index(st, true);
        verify_db(st);

    }

    if (fconfig.compaction_mode != FDB_COMPACTION_AUTO) {
        /* replay involves rollbacks but
         * cannot rollback pre compact due to BUG: MB-13130
         */
        replay(st);
    }

    // teardown
    e2e_fdb_shutdown(st);

    memleak_end();
}